

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger base_print(HSQUIRRELVM v,SQPRINTFUNCTION pf,bool newline)

{
  char *pcVar1;
  byte bVar2;
  SQRESULT SVar3;
  byte in_DL;
  HSQUIRRELVM in_RSI;
  undefined8 in_RDI;
  SQChar *str;
  SQChar **in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  SQInteger local_8;
  
  bVar2 = in_DL & 1;
  SVar3 = sq_tostring(v,(SQInteger)pf);
  if ((SVar3 < 0) ||
     (SVar3 = sq_getstring(in_RSI,CONCAT17(bVar2,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffd8), SVar3 < 0)) {
    local_8 = -1;
  }
  else {
    if (in_RSI != (HSQUIRRELVM)0x0) {
      pcVar1 = "can\'t \'++\' or \'--\' %s";
      if ((bVar2 & 1) != 0) {
        pcVar1 = "Unknown warning ID %s\n";
      }
      (*(code *)in_RSI)(in_RDI,pcVar1 + 0x13,in_stack_ffffffffffffffd8);
    }
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static SQInteger base_print(HSQUIRRELVM v, SQPRINTFUNCTION pf, bool newline)
{
    if(SQ_SUCCEEDED(sq_tostring(v,2)))
    {
        const SQChar *str;
        if(SQ_SUCCEEDED(sq_getstring(v,-1,&str))) {
            if(pf)
                pf(v, newline ? _SC("%s\n") : _SC("%s"), str);
            return 0;
        }
    }
    return SQ_ERROR;
}